

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

size_t read_metadata_hdr_cll(AV1Decoder *pbi,uint8_t *data,size_t sz)

{
  ulong in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  AV1Decoder *unaff_retaddr;
  size_t kHdrCllPayloadSize;
  aom_metadata_insert_flags_t insert_flag;
  
  insert_flag = AOM_MIF_NON_KEY_FRAME;
  if (in_RDX < 4) {
    insert_flag = AOM_MIF_NON_KEY_FRAME;
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                       "Incorrect HDR CLL metadata payload size");
  }
  alloc_read_metadata(unaff_retaddr,(OBU_METADATA_TYPE)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,
                      insert_flag);
  return 4;
}

Assistant:

static size_t read_metadata_hdr_cll(AV1Decoder *const pbi, const uint8_t *data,
                                    size_t sz) {
  const size_t kHdrCllPayloadSize = 4;
  if (sz < kHdrCllPayloadSize) {
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "Incorrect HDR CLL metadata payload size");
  }
  alloc_read_metadata(pbi, OBU_METADATA_TYPE_HDR_CLL, data, kHdrCllPayloadSize,
                      AOM_MIF_ANY_FRAME);
  return kHdrCllPayloadSize;
}